

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O0

void __thiscall CcsTest_Coercion_Test::TestBody(CcsTest_Coercion_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_2b8;
  Message local_2b0;
  allocator local_2a1;
  string local_2a0;
  bool local_27a;
  bool local_279;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_3;
  Message local_260;
  allocator local_251;
  string local_250;
  double local_230;
  double local_228;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_2;
  Message local_208;
  allocator local_1f9;
  string local_1f8;
  double local_1d8;
  double local_1d0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_1;
  Message local_1b0;
  allocator local_1a1;
  string local_1a0;
  int local_180 [2];
  undefined1 local_178 [8];
  AssertionResult gtest_ar;
  CcsContext ctx;
  string local_150 [39];
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88;
  undefined1 local_58 [32];
  string local_38;
  CcsDomain local_18;
  CcsDomain ccs;
  CcsTest_Coercion_Test *this_local;
  
  ccs.dag._M_t.super___uniq_ptr_impl<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>._M_t.
  super__Tuple_impl<0UL,_ccs::DagBuilder_*,_std::default_delete<ccs::DagBuilder>_>.
  super__Head_base<0UL,_ccs::DagBuilder_*,_false>._M_head_impl =
       (unique_ptr<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>)
       (unique_ptr<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>)this;
  ::ccs::CcsDomain::CcsDomain(&local_18,false);
  ::ccs::CcsDomain::ruleBuilder((CcsDomain *)local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"int",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"123",&local_b1);
  ::ccs::RuleBuilder::set((RuleBuilder *)(local_58 + 0x10),(string *)local_58,&local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"double",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"123.0",&local_101);
  ::ccs::RuleBuilder::set((RuleBuilder *)&local_38,(string *)(local_58 + 0x10),&local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"bool",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_150,"true",
             (allocator *)
             ((long)&ctx.searchState.
                     super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  ::ccs::RuleBuilder::set((RuleBuilder *)&local_38.field_2,&local_38,&local_128);
  ::ccs::RuleBuilder::~RuleBuilder((RuleBuilder *)&local_38.field_2);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ctx.searchState.
                     super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  ::ccs::RuleBuilder::~RuleBuilder((RuleBuilder *)&local_38);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  ::ccs::RuleBuilder::~RuleBuilder((RuleBuilder *)(local_58 + 0x10));
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  ::ccs::RuleBuilder::~RuleBuilder((RuleBuilder *)local_58);
  ::ccs::CcsDomain::build((CcsDomain *)&gtest_ar.message_);
  local_180[1] = 0x7b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,"int",&local_1a1);
  local_180[0] = ::ccs::CcsContext::getInt((CcsContext *)&gtest_ar.message_,&local_1a0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_178,"123","ctx.getInt(\"int\")",local_180 + 1,local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xdc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  local_1d0 = 123.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f8,"int",&local_1f9);
  local_1d8 = ::ccs::CcsContext::getDouble((CcsContext *)&gtest_ar.message_,&local_1f8);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_1c8,"123.0","ctx.getDouble(\"int\")",&local_1d0,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xdd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  local_228 = 123.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_250,"double",&local_251);
  local_230 = ::ccs::CcsContext::getDouble((CcsContext *)&gtest_ar.message_,&local_250);
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_220,"123.0","ctx.getDouble(\"double\")",&local_228,&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xde,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  local_279 = true;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"bool",&local_2a1);
  local_27a = ::ccs::CcsContext::getBool((CcsContext *)&gtest_ar.message_,&local_2a0);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_278,"true","ctx.getBool(\"bool\")",&local_279,&local_27a);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xdf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  ::ccs::CcsContext::~CcsContext((CcsContext *)&gtest_ar.message_);
  ::ccs::CcsDomain::~CcsDomain(&local_18);
  return;
}

Assistant:

TEST(CcsTest, Coercion) {
  CcsDomain ccs;
  ccs.ruleBuilder()
      .set("int", "123")
      .set("double", "123.0")
      .set("bool", "true");
  CcsContext ctx = ccs.build();
  EXPECT_EQ(123, ctx.getInt("int"));
  EXPECT_EQ(123.0, ctx.getDouble("int"));
  EXPECT_EQ(123.0, ctx.getDouble("double"));
  EXPECT_EQ(true, ctx.getBool("bool"));
}